

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

bool __thiscall
cmELFInternalImpl<cmELFTypes32>::Read(cmELFInternalImpl<cmELFTypes32> *this,ELF_Ehdr *x)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  uint uVar6;
  
  plVar5 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream,(long)x);
  uVar3 = *(uint *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20);
  if ((uVar3 & 5) == 0) {
    uVar2 = x->e_type;
    uVar6 = (uint)uVar2;
    bVar1 = (this->super_cmELFInternal).NeedSwap;
    uVar4 = (uint)(uVar2 >> 8);
    if (bVar1 == false) {
      uVar4 = (uint)uVar2;
      uVar6 = (uint)(uVar2 >> 8);
    }
    if ((((uVar6 * 0x100 & 0xffff) != 0xfe00) &&
        (0x104 < (uVar6 * 0x100 + (uVar4 & 0xff) + 0x100 & 0xffff))) &&
       (((uVar4 * 0x100 & 0xffff) == 0xfe00 ||
        ((uVar4 * 0x100 + (uVar6 & 0xff) + 0x100 & 0xffff) < 0x105)))) {
      (this->super_cmELFInternal).NeedSwap = (bool)(bVar1 ^ 1);
    }
    if ((this->super_cmELFInternal).NeedSwap == true) {
      ByteSwap(this,x);
    }
  }
  return (uVar3 & 5) == 0;
}

Assistant:

bool Read(ELF_Ehdr& x)
    {
    // Read the header from the file.
    if(!this->Stream.read(reinterpret_cast<char*>(&x), sizeof(x)))
      {
      return false;
      }

    // The byte order of ELF header fields may not match that of the
    // processor-specific data.  The header fields are ordered to
    // match the target execution environment, so we may need to
    // memorize the order of all platforms based on the e_machine
    // value.  As a heuristic, if the type is invalid but its
    // swapped value is okay then flip our swap mode.
    ELF_Half et = x.e_type;
    if(this->NeedSwap)
      {
      cmELFByteSwap(et);
      }
    if(!this->FileTypeValid(et))
      {
      cmELFByteSwap(et);
      if(this->FileTypeValid(et))
        {
        // The previous byte order guess was wrong.  Flip it.
        this->NeedSwap = !this->NeedSwap;
        }
      }

    // Fix the byte order of the header.
    if(this->NeedSwap)
      {
      ByteSwap(x);
      }
    return true;
    }